

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_decoder.c
# Opt level: O1

void lzma_decoder_reset(void *coder_ptr,void *opt)

{
  int iVar1;
  int iVar2;
  uint32_t bt_i_6;
  byte bVar3;
  uint32_t i_2;
  uint32_t i_1;
  long lVar4;
  uint32_t j;
  long lVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  uint32_t j_1;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  uint32_t bt_i_5;
  void *pvVar12;
  uint32_t bt_i_3;
  uint32_t bt_i_2;
  
  bVar3 = (byte)*(undefined4 *)((long)opt + 0x1c);
  uVar8 = -1 << (bVar3 & 0x1f);
  uVar9 = ~uVar8;
  *(uint *)((long)coder_ptr + 0x6e8c) = uVar9;
  iVar1 = *(int *)((long)opt + 0x14);
  iVar2 = *(int *)((long)opt + 0x18);
  uVar11 = iVar2 + iVar1;
  if (uVar11 < 5) {
    uVar6 = 0;
    pvVar12 = coder_ptr;
    do {
      lVar5 = 0;
      do {
        *(undefined2 *)((long)pvVar12 + lVar5 * 2) = 0x400;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x300);
      uVar6 = uVar6 + 1;
      pvVar12 = (void *)((long)pvVar12 + 0x600);
    } while (uVar6 >> ((byte)uVar11 & 0x1f) == 0);
    *(int *)((long)coder_ptr + 0x6e90) = iVar1;
    *(int *)((long)coder_ptr + 0x6e94) = ~(-1 << ((byte)iVar2 & 0x1f));
    *(undefined8 *)((long)coder_ptr + 0x6e78) = 0;
    *(undefined8 *)((long)coder_ptr + 0x6e80) = 0;
    *(undefined4 *)((long)coder_ptr + 0x6e88) = 0;
    *(uint *)((long)coder_ptr + 0x6e8c) = uVar9;
    *(undefined8 *)((long)coder_ptr + 0x6e6c) = 0xffffffff;
    *(undefined4 *)((long)coder_ptr + 0x6e74) = 5;
    lVar5 = (long)coder_ptr + 0x61e0;
    lVar4 = 0;
    do {
      uVar10 = 0;
      do {
        *(undefined2 *)(lVar5 + -0x1e0 + uVar10 * 2) = 0x400;
        *(undefined2 *)(lVar5 + uVar10 * 2) = 0x400;
        uVar10 = uVar10 + 1;
      } while (-uVar8 != uVar10);
      *(undefined2 *)((long)coder_ptr + lVar4 * 2 + 0x6180) = 0x400;
      *(undefined2 *)((long)coder_ptr + lVar4 * 2 + 0x6198) = 0x400;
      *(undefined2 *)((long)coder_ptr + lVar4 * 2 + 0x61b0) = 0x400;
      *(undefined2 *)((long)coder_ptr + lVar4 * 2 + 0x61c8) = 0x400;
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0x20;
    } while (lVar4 != 0xc);
    lVar5 = (long)coder_ptr + 0x6360;
    lVar4 = 0;
    do {
      lVar7 = 0;
      do {
        *(undefined2 *)(lVar5 + lVar7 * 2) = 0x400;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x40);
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0x80;
    } while (lVar4 != 4);
    lVar5 = 0;
    do {
      *(undefined2 *)((long)coder_ptr + lVar5 * 2 + 0x6560) = 0x400;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x72);
    lVar5 = 0;
    do {
      *(undefined2 *)((long)coder_ptr + lVar5 * 2 + 0x6644) = 0x400;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x10);
    *(undefined4 *)((long)coder_ptr + 0x6664) = 0x4000400;
    *(undefined4 *)((long)coder_ptr + 0x6a68) = 0x4000400;
    uVar11 = 0;
    do {
      lVar5 = (ulong)uVar11 * 0x10;
      lVar4 = 0;
      do {
        *(undefined2 *)((long)coder_ptr + lVar4 * 2 + lVar5 + 0x6668) = 0x400;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 8);
      lVar4 = 0;
      do {
        *(undefined2 *)((long)coder_ptr + lVar4 * 2 + lVar5 + 0x6768) = 0x400;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 8);
      lVar4 = 0;
      do {
        *(undefined2 *)((long)coder_ptr + lVar4 * 2 + lVar5 + 0x6a6c) = 0x400;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 8);
      lVar4 = 0;
      do {
        *(undefined2 *)((long)coder_ptr + lVar4 * 2 + lVar5 + 0x6b6c) = 0x400;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 8);
      uVar11 = uVar11 + 1;
    } while (uVar11 >> (bVar3 & 0x1f) == 0);
    lVar5 = 0;
    do {
      *(undefined2 *)((long)coder_ptr + lVar5 * 2 + 0x6868) = 0x400;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x100);
    lVar5 = 0;
    do {
      *(undefined2 *)((long)coder_ptr + lVar5 * 2 + 0x6c6c) = 0x400;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x100);
    *(undefined4 *)((long)coder_ptr + 0x6ea0) = 1;
    *(undefined8 *)((long)coder_ptr + 0x6ea8) = 0;
    *(undefined8 *)((long)coder_ptr + 0x6eb0) = 0;
    *(undefined8 *)((long)coder_ptr + 0x6eb8) = 0;
    return;
  }
  __assert_fail("lc + lp <= LZMA_LCLP_MAX",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_common.h"
                ,0x85,"void literal_init(probability (*)[768], uint32_t, uint32_t)");
}

Assistant:

static void
lzma_decoder_reset(void *coder_ptr, const void *opt)
{
	lzma_lzma1_decoder *coder = coder_ptr;
	const lzma_options_lzma *options = opt;

	// NOTE: We assume that lc/lp/pb are valid since they were
	// successfully decoded with lzma_lzma_decode_properties().

	// Calculate pos_mask. We don't need pos_bits as is for anything.
	coder->pos_mask = (1U << options->pb) - 1;

	// Initialize the literal decoder.
	literal_init(coder->literal, options->lc, options->lp);

	coder->literal_context_bits = options->lc;
	coder->literal_pos_mask = (1U << options->lp) - 1;

	// State
	coder->state = STATE_LIT_LIT;
	coder->rep0 = 0;
	coder->rep1 = 0;
	coder->rep2 = 0;
	coder->rep3 = 0;
	coder->pos_mask = (1U << options->pb) - 1;

	// Range decoder
	rc_reset(coder->rc);

	// Bit and bittree decoders
	for (uint32_t i = 0; i < STATES; ++i) {
		for (uint32_t j = 0; j <= coder->pos_mask; ++j) {
			bit_reset(coder->is_match[i][j]);
			bit_reset(coder->is_rep0_long[i][j]);
		}

		bit_reset(coder->is_rep[i]);
		bit_reset(coder->is_rep0[i]);
		bit_reset(coder->is_rep1[i]);
		bit_reset(coder->is_rep2[i]);
	}

	for (uint32_t i = 0; i < DIST_STATES; ++i)
		bittree_reset(coder->dist_slot[i], DIST_SLOT_BITS);

	for (uint32_t i = 0; i < FULL_DISTANCES - DIST_MODEL_END; ++i)
		bit_reset(coder->pos_special[i]);

	bittree_reset(coder->pos_align, ALIGN_BITS);

	// Len decoders (also bit/bittree)
	const uint32_t num_pos_states = 1U << options->pb;
	bit_reset(coder->match_len_decoder.choice);
	bit_reset(coder->match_len_decoder.choice2);
	bit_reset(coder->rep_len_decoder.choice);
	bit_reset(coder->rep_len_decoder.choice2);

	for (uint32_t pos_state = 0; pos_state < num_pos_states; ++pos_state) {
		bittree_reset(coder->match_len_decoder.low[pos_state],
				LEN_LOW_BITS);
		bittree_reset(coder->match_len_decoder.mid[pos_state],
				LEN_MID_BITS);

		bittree_reset(coder->rep_len_decoder.low[pos_state],
				LEN_LOW_BITS);
		bittree_reset(coder->rep_len_decoder.mid[pos_state],
				LEN_MID_BITS);
	}

	bittree_reset(coder->match_len_decoder.high, LEN_HIGH_BITS);
	bittree_reset(coder->rep_len_decoder.high, LEN_HIGH_BITS);

	coder->sequence = SEQ_IS_MATCH;
	coder->probs = NULL;
	coder->symbol = 0;
	coder->limit = 0;
	coder->offset = 0;
	coder->len = 0;

	return;
}